

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

void * Abc_ObjMvVar(Abc_Obj_t *pObj)

{
  void *pvVar1;
  Vec_Att_t *p;
  void *local_18;
  Abc_Obj_t *pObj_local;
  
  pvVar1 = Abc_NtkMvVar(pObj->pNtk);
  if (pvVar1 == (void *)0x0) {
    local_18 = (void *)0x0;
  }
  else {
    p = (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk);
    local_18 = Vec_AttEntry(p,pObj->Id);
  }
  return local_18;
}

Assistant:

static inline void *      Abc_ObjMvVar( Abc_Obj_t * pObj )              { return Abc_NtkMvVar(pObj->pNtk)? Vec_AttEntry( (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk), pObj->Id ) : NULL; }